

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

exception<kratos::InternalException> * __thiscall
pybind11::exception<kratos::InternalException>::operator=
          (exception<kratos::InternalException> *this,exception<kratos::InternalException> *param_1)

{
  exception<kratos::InternalException> *param_1_local;
  exception<kratos::InternalException> *this_local;
  
  object::operator=(&this->super_object,&param_1->super_object);
  return this;
}

Assistant:

exception(handle scope, const char *name, handle base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base.ptr(), NULL);
        if (hasattr(scope, "__dict__") && scope.attr("__dict__").contains(name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }